

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O2

bool __thiscall test_CECoordinates::test_Convert2Cirs(test_CECoordinates *this)

{
  CECoordinates *this_00;
  CEDate *this_01;
  CECoordinates *pCVar1;
  CEObserver *this_02;
  undefined1 uVar2;
  double dVar3;
  double dec;
  double ra;
  CECoordinates obs2cirs;
  CECoordinates gal2cirs;
  CECoordinates icrs2cirs;
  CECoordinates cirs2cirs;
  CECoordinateType local_194;
  double local_190;
  double local_188;
  double local_180;
  CEAngle local_178;
  CEAngle local_168 [2];
  CECoordinates local_148;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  CECoordinates local_d0;
  double local_a0;
  double local_98;
  CECoordinates local_90;
  CECoordinates local_60;
  
  local_188 = 0.0;
  local_190 = 0.0;
  this_00 = &this->base_cirs_;
  dVar3 = CEDate::CurrentJD();
  CECoordinates::ConvertToCIRS(&local_60,this_00,dVar3,0.0,0.0,0.0,-1.0,-1000.0,0.0,0.0,0.0,0.0,0.5)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"test_Convert2Cirs",(allocator *)&local_148);
  local_d0._vptr_CECoordinates._0_4_ = 0xbe;
  (**(code **)(*(long *)this + 200))(this,&local_60,this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_148);
  this_01 = &this->base_date_;
  dVar3 = CEDate::operator_cast_to_double(this_01);
  pCVar1 = &this->base_icrs_;
  CECoordinates::ConvertToCIRS(&local_90,pCVar1,dVar3,0.0,0.0,0.0,-1.0,-1000.0,0.0,0.0,0.0,0.0,0.5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"test_Convert2Cirs",(allocator *)local_168);
  local_148._vptr_CECoordinates._0_4_ = 0xc2;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_168);
  dVar3 = CppEphem::julian_date_J2000();
  local_180 = CECoordinates::XCoordinate_Deg(pCVar1,dVar3);
  dVar3 = CppEphem::julian_date_J2000();
  dVar3 = CECoordinates::YCoordinate_Deg(pCVar1,dVar3);
  local_d0._vptr_CECoordinates._0_4_ = 0;
  CECoordinates::ICRS2CIRS(local_180,dVar3,&local_188,&local_190,this_01,(CEAngleType *)&local_d0);
  CEAngle::Deg((CEAngle *)&local_d0,&local_188);
  CEAngle::Deg((CEAngle *)&local_148,&local_190);
  local_168[0]._vptr_CEAngle._0_4_ = 0;
  CECoordinates::SetCoordinates
            (&local_90,(CEAngle *)&local_d0,(CEAngle *)&local_148,(CECoordinateType *)local_168);
  CEAngle::~CEAngle((CEAngle *)&local_148);
  CEAngle::~CEAngle((CEAngle *)&local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"test_Convert2Cirs",(allocator *)local_168);
  local_148._vptr_CECoordinates._0_4_ = 0xc9;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_168);
  dVar3 = CEDate::operator_cast_to_double(this_01);
  pCVar1 = &this->base_gal_;
  CECoordinates::ConvertToCIRS(&local_d0,pCVar1,dVar3,0.0,0.0,0.0,-1.0,-1000.0,0.0,0.0,0.0,0.0,0.5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"test_Convert2Cirs",(allocator *)&local_178);
  local_168[0]._vptr_CEAngle._0_4_ = 0xcd;
  (**(code **)(*(long *)this + 200))(this,&local_d0,this_00,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_178);
  local_188 = 0.0;
  local_190 = 0.0;
  dVar3 = CppEphem::julian_date_J2000();
  local_180 = CECoordinates::XCoordinate_Deg(pCVar1,dVar3);
  dVar3 = CppEphem::julian_date_J2000();
  dVar3 = CECoordinates::YCoordinate_Deg(pCVar1,dVar3);
  local_148._vptr_CECoordinates._0_4_ = 0;
  CECoordinates::Galactic2CIRS
            (local_180,dVar3,&local_188,&local_190,this_01,(CEAngleType *)&local_148);
  CEAngle::Deg((CEAngle *)&local_148,&local_188);
  CEAngle::Deg(local_168,&local_190);
  local_178._vptr_CEAngle._0_4_ = 0;
  CECoordinates::SetCoordinates
            (&local_90,(CEAngle *)&local_148,local_168,(CECoordinateType *)&local_178);
  CEAngle::~CEAngle(local_168);
  CEAngle::~CEAngle((CEAngle *)&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"test_Convert2Cirs",(allocator *)&local_178);
  local_168[0]._vptr_CEAngle._0_4_ = 0xd6;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_00,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_178);
  local_180 = CEDate::operator_cast_to_double(this_01);
  this_02 = &this->base_observer_;
  local_d8 = CEObserver::Longitude_Rad(this_02);
  local_e0 = CEObserver::Latitude_Rad(this_02);
  local_e8 = CEObserver::Elevation_m(this_02);
  local_f0 = CEObserver::Pressure_hPa(this_02);
  local_f8 = CEObserver::Temperature_C(this_02);
  local_100 = CEObserver::RelativeHumidity(this_02);
  local_108 = CEDate::dut1(this_01);
  local_110 = CEDate::xpolar(this_01);
  local_118 = CEDate::ypolar(this_01);
  pCVar1 = &this->base_obs_;
  dVar3 = CEObserver::Wavelength_um(this_02);
  CECoordinates::ConvertToCIRS
            (&local_148,pCVar1,local_180,local_d8,local_e0,local_e8,local_f0,local_f8,local_100,
             local_108,local_110,local_118,dVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_168,"test_Convert2Cirs",(allocator *)&local_194);
  local_178._vptr_CEAngle._0_4_ = 0xe5;
  (**(code **)(*(long *)this + 200))(this,&local_148,this_00,local_168);
  std::__cxx11::string::~string((string *)local_168);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_194);
  local_188 = 0.0;
  local_190 = 0.0;
  dVar3 = CppEphem::julian_date_J2000();
  local_180 = CECoordinates::XCoordinate_Deg(pCVar1,dVar3);
  dVar3 = CppEphem::julian_date_J2000();
  dVar3 = CECoordinates::YCoordinate_Deg(pCVar1,dVar3);
  local_168[0]._vptr_CEAngle._0_4_ = 0;
  CECoordinates::Observed2CIRS
            (local_180,dVar3,&local_188,&local_190,this_01,this_02,(CEAngleType *)local_168);
  CEAngle::Deg(local_168,&local_188);
  CEAngle::Deg(&local_178,&local_190);
  local_194 = CIRS;
  CECoordinates::SetCoordinates(&local_148,local_168,&local_178,&local_194);
  CEAngle::~CEAngle(&local_178);
  CEAngle::~CEAngle(local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_168,"test_Convert2Cirs",(allocator *)&local_194);
  local_178._vptr_CEAngle._0_4_ = 0xf0;
  (**(code **)(*(long *)this + 200))(this,&local_148,this_00,local_168);
  std::__cxx11::string::~string((string *)local_168);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_194);
  local_188 = 0.0;
  local_190 = 0.0;
  dVar3 = CppEphem::julian_date_J2000();
  local_180 = CECoordinates::XCoordinate_Rad(pCVar1,dVar3);
  dVar3 = CppEphem::julian_date_J2000();
  local_d8 = CECoordinates::YCoordinate_Rad(pCVar1,dVar3);
  local_e0 = CEDate::JD(this_01);
  local_e8 = CEObserver::Longitude_Rad(this_02);
  local_f0 = CEObserver::Latitude_Rad(this_02);
  local_f8 = CEObserver::Elevation_m(this_02);
  local_100 = CEObserver::Pressure_hPa(this_02);
  local_108 = CEObserver::Temperature_C(this_02);
  local_110 = CEObserver::RelativeHumidity(this_02);
  local_118 = CEDate::dut1(this_01);
  local_98 = CEDate::xpolar(this_01);
  local_a0 = CEDate::ypolar(this_01);
  dVar3 = CEObserver::Wavelength_um(this_02);
  CECoordinates::Observed2CIRS
            (local_180,local_d8,&local_188,&local_190,local_e0,local_e8,local_f0,local_f8,local_100,
             local_108,local_110,local_118,local_98,local_a0,dVar3);
  CEAngle::Rad(local_168,&local_188);
  CEAngle::Rad(&local_178,&local_190);
  local_194 = CIRS;
  CECoordinates::SetCoordinates(&local_148,local_168,&local_178,&local_194);
  CEAngle::~CEAngle(&local_178);
  CEAngle::~CEAngle(local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_168,"test_Convert2Cirs",(allocator *)&local_194);
  local_178._vptr_CEAngle._0_4_ = 0x104;
  (**(code **)(*(long *)this + 200))(this,&local_148,this_00,local_168);
  std::__cxx11::string::~string((string *)local_168);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_194);
  uVar2 = (**(code **)(*(long *)this + 0x18))(this);
  CECoordinates::~CECoordinates(&local_148);
  CECoordinates::~CECoordinates(&local_d0);
  CECoordinates::~CECoordinates(&local_90);
  CECoordinates::~CECoordinates(&local_60);
  return (bool)uVar2;
}

Assistant:

bool test_CECoordinates::test_Convert2Cirs()
{
    double ra(0.0);
    double dec(0.0);

    // CIRS -> CIRS
    CECoordinates cirs2cirs = base_cirs_.ConvertToCIRS();
    test_coords(cirs2cirs, base_cirs_, __func__, __LINE__);

    // ICRS -> CIRS
    CECoordinates icrs2cirs = base_icrs_.ConvertToCIRS(base_date_);
    test_coords(icrs2cirs, base_cirs_, __func__, __LINE__);

    CECoordinates::ICRS2CIRS(base_icrs_.XCoordinate_Deg(), 
                             base_icrs_.YCoordinate_Deg(),
                             &ra, &dec, base_date_, CEAngleType::DEGREES);
    icrs2cirs.SetCoordinates(CEAngle::Deg(ra), CEAngle::Deg(dec), 
                             CECoordinateType::CIRS);
    test_coords(icrs2cirs, base_cirs_, __func__, __LINE__);

    // Galactic -> CIRS
    CECoordinates gal2cirs = base_gal_.ConvertToCIRS(base_date_);
    test_coords(gal2cirs, base_cirs_, __func__, __LINE__);

    ra  = 0.0;
    dec = 0.0;
    CECoordinates::Galactic2CIRS(base_gal_.XCoordinate_Deg(), 
                                 base_gal_.YCoordinate_Deg(),
                                 &ra, &dec, base_date_, CEAngleType::DEGREES);
    icrs2cirs.SetCoordinates(CEAngle::Deg(ra), CEAngle::Deg(dec), 
                             CECoordinateType::CIRS);
    test_coords(icrs2cirs, base_cirs_, __func__, __LINE__);

    // Observed -> CIRS
    CECoordinates obs2cirs = base_obs_.ConvertToCIRS(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(obs2cirs, base_cirs_, __func__, __LINE__);

    // Observed -> CIRS (direct v1)
    ra  = 0.0;
    dec = 0.0;
    CECoordinates::Observed2CIRS(base_obs_.XCoordinate_Deg(), 
                                 base_obs_.YCoordinate_Deg(),
                                 &ra, &dec, base_date_, base_observer_,
                                 CEAngleType::DEGREES);
    obs2cirs.SetCoordinates(CEAngle::Deg(ra), CEAngle::Deg(dec), 
                             CECoordinateType::CIRS);
    test_coords(obs2cirs, base_cirs_, __func__, __LINE__);

    // Observed -> CIRS (direct v2)
    ra  = 0.0;
    dec = 0.0;
    CECoordinates::Observed2CIRS(base_obs_.XCoordinate_Rad(), 
                                 base_obs_.YCoordinate_Rad(),
                                 &ra, &dec, base_date_.JD(), 
                                 base_observer_.Longitude_Rad(),
                                 base_observer_.Latitude_Rad(),
                                 base_observer_.Elevation_m(),
                                 base_observer_.Pressure_hPa(),
                                 base_observer_.Temperature_C(),
                                 base_observer_.RelativeHumidity(),
                                 base_date_.dut1(),
                                 base_date_.xpolar(),
                                 base_date_.ypolar(),
                                 base_observer_.Wavelength_um());
    obs2cirs.SetCoordinates(CEAngle::Rad(ra), CEAngle::Rad(dec), 
                             CECoordinateType::CIRS);
    test_coords(obs2cirs, base_cirs_, __func__, __LINE__);

    return pass();
}